

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O2

string * __thiscall
vkt::shaderexecutor::(anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs,
          char *inputPrefix,char *outputPrefix)

{
  ostream *poVar1;
  string *psVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ostringstream src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  DeclareVariable local_228;
  DeclareVariable local_1e8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"#version 310 es\nlayout(location = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,") in highp vec4 a_position;\n");
  iVar3 = 0;
  for (__rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this;
      __rhs != *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&__rhs[1].field_2 + 8)) {
    poVar1 = std::operator<<((ostream *)local_1a8,"layout(location = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3 + 1);
    poVar1 = std::operator<<(poVar1,") in ");
    std::operator+(&local_248,"a_",__rhs);
    glu::decl::DeclareVariable::DeclareVariable(&local_228,(VarType *)(__rhs + 1),&local_248,0);
    poVar1 = glu::decl::operator<<(poVar1,&local_228);
    poVar1 = std::operator<<(poVar1,";\n");
    poVar1 = std::operator<<(poVar1,"layout(location = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
    poVar1 = std::operator<<(poVar1,") flat out ");
    std::operator+(&local_268,"vtx_out_",__rhs);
    glu::decl::DeclareVariable::DeclareVariable(&local_1e8,(VarType *)(__rhs + 1),&local_268,0);
    poVar1 = glu::decl::operator<<(poVar1,&local_1e8);
    std::operator<<(poVar1,";\n");
    glu::decl::DeclareVariable::~DeclareVariable(&local_1e8);
    std::__cxx11::string::~string((string *)&local_268);
    glu::decl::DeclareVariable::~DeclareVariable(&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    iVar3 = iVar3 + 1;
  }
  poVar1 = std::operator<<((ostream *)local_1a8,"\nvoid main (void)\n{\n");
  poVar1 = std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  std::operator<<(poVar1,"\tgl_PointSize = 1.0;\n");
  for (psVar2 = *(string **)this; psVar2 != *(string **)(this + 8); psVar2 = psVar2 + 0x38) {
    poVar1 = std::operator<<((ostream *)local_1a8,"\t");
    poVar1 = std::operator<<(poVar1,"vtx_out_");
    poVar1 = std::operator<<(poVar1,psVar2);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,"a_");
    poVar1 = std::operator<<(poVar1,psVar2);
    std::operator<<(poVar1,";\n");
  }
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

static std::string generatePassthroughVertexShader (const std::vector<Symbol>& inputs, const char* inputPrefix, const char* outputPrefix)
{

	std::ostringstream	src;
	int					location	= 0;

	src <<	"#version 310 es\n"
			"layout(location = " << location << ") in highp vec4 a_position;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
	{
		location++;
		src << "layout(location = "<< location << ") in " << glu::declare(input->varType, inputPrefix + input->name) << ";\n"
			<< "layout(location = " << location - 1 << ") flat out " << glu::declare(input->varType, outputPrefix + input->name) << ";\n";
	}

	src << "\nvoid main (void)\n{\n"
		<< "	gl_Position = a_position;\n"
		<< "	gl_PointSize = 1.0;\n";

	for (vector<Symbol>::const_iterator input = inputs.begin(); input != inputs.end(); ++input)
		src << "\t" << outputPrefix << input->name << " = " << inputPrefix << input->name << ";\n";

	src << "}\n";

	return src.str();
}